

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cc
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int in_R8D;
  undefined8 uStack_1f0;
  _InputArray local_1e0;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> smiles;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  string img_name;
  string smile_name;
  Mat img;
  Mat image_gray;
  Mat local_90 [96];
  
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,
                    "\nThis program demonstrates the smile detector.\nContains two functions:\n1.Converting Video Files to Pictures.\n2.Extract the smiling pictures from the pictures.\n\nUsage:\n./smile [--url=<the URL of the incoming video>]\n\nExample:\n./videocover http://vodm2lzexwq.vod.126.net/vodm2lzexwq/4673d4ae-7078-42c1-affb-494b4ad0e687.mp4?resId=254486990bfa2cd7aa860229db639341_1919639027_0&sign=i9VRqSZZJDUI%2B3hka7EpMg12silSgknLl2iTUoyqKT8%3D\n\n"
                   );
    std::operator<<((ostream *)&std::cout,"\tUsing OpenCV version 4.0.1.\n\n\n");
    return 0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&smile_name,"smile.png",(allocator<char> *)&img);
  iVar2 = download(argv[1],"video.mp4");
  if (iVar2 == -1) {
    printf("[%s][%s(%d)]:Download video error.\n","MSG_ERROR","main",0x34);
    uStack_1f0 = 0x35;
  }
  else {
    printf("[%s][%s(%d)]:Download video successful!\n","MSG_INFO","main",0x38);
    iVar2 = __mkdir__("./video");
    if (iVar2 == -1) {
      printf("[%s][%s(%d)]:Create dir error!\n","MSG_ERROR","main",0x3b);
      uStack_1f0 = 0x3c;
    }
    else {
      printf("[%s][%s(%d)]:Create dir successful!\n","MSG_INFO","main",0x3f);
      video_to_image("video.mp4","./video");
      printf("[%s][%s(%d)]:Video convert image successful!\n","MSG_INFO","main");
      for (iVar2 = 1; iVar2 != 9999; iVar2 = iVar2 + 1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &image_gray,"./video",&forward_slash_abi_cxx11_);
        std::__cxx11::to_string((string *)&smiles,iVar2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&img,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &image_gray,(string *)&smiles);
        std::operator+(&img_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&img,
                       &suffix_png_abi_cxx11_);
        std::__cxx11::string::~string((string *)&img);
        std::__cxx11::string::~string((string *)&smiles);
        std::__cxx11::string::~string((string *)&image_gray);
        cv::imread((string *)&img,(int)&img_name);
        cVar1 = cv::Mat::empty();
        if (cVar1 != '\0') {
          cv::Mat::~Mat(&img);
          std::__cxx11::string::~string((string *)&img_name);
          break;
        }
        cv::Mat::Mat(&image_gray);
        smiles.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1e0.sz.width = 0;
        local_1e0.sz.height = 0;
        smiles.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x1010000;
        local_1e0.flags = 0x2010000;
        local_1e0.obj =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image_gray;
        smiles.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&img;
        cv::cvtColor((cv *)&smiles,&local_1e0,(_OutputArray *)0x6,0,in_R8D);
        smiles.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1e0.sz.width = 0;
        local_1e0.sz.height = 0;
        smiles.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = 0x1010000;
        local_1e0.flags = 0x2010000;
        local_1e0.obj =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&image_gray;
        smiles.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&image_gray;
        cv::equalizeHist((_InputArray *)&smiles,(_OutputArray *)&local_1e0);
        cv::Mat::Mat(local_90,&image_gray);
        detectSmile(&smiles,local_90);
        cv::Mat::~Mat(local_90);
        if ((pointer)CONCAT44(smiles.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              smiles.
                              super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_4_) !=
            smiles.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_1e0.sz.width = 0;
          local_1e0.sz.height = 0;
          local_1e0.flags = 0x1010000;
          local_1a8 = 0;
          uStack_1a0 = 0;
          local_198 = 0;
          local_1e0.obj = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&img;
          cv::imwrite((string *)&smile_name,&local_1e0,(vector *)&local_1a8);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&local_1a8);
        }
        std::_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~_Vector_base
                  ((_Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)&smiles);
        cv::Mat::~Mat(&image_gray);
        cv::Mat::~Mat(&img);
        std::__cxx11::string::~string((string *)&img_name);
      }
      printf("[%s][%s(%d)]:Smile detector successful!\n","MSG_INFO","main",0x58);
      iVar2 = __rmdir__("./video");
      if (iVar2 != -1) {
        iVar2 = 0;
        printf("[%s][%s(%d)]:Delete temp dir successful!\n","MSG_INFO","main",0x5f);
        goto LAB_00105334;
      }
      printf("[%s][%s(%d)]:Delete temp dir error.\n","MSG_ERROR","main",0x5b);
      uStack_1f0 = 0x5c;
    }
  }
  printf("[%s][%s(%d)]:Return code -1.\n","MSG_INFO","main",uStack_1f0);
  iVar2 = -1;
LAB_00105334:
  std::__cxx11::string::~string((string *)&smile_name);
  return iVar2;
}

Assistant:

int main(int argc, const char *argv[]) {
  if (argc < 2) {
    help();
    return 0;
  }
  const char *video_name = "video.mp4";
  const char *dir_name = "./video";
  string smile_name = "smile.png";
  if (download(argv[1], video_name) == -1) {
    lprintf(MSG_ERROR, "Download video error.\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Download video successful!\n");

  if (__mkdir__(dir_name) == -1) {
    lprintf(MSG_ERROR, "Create dir error!\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Create dir successful!\n");

  if (video_to_image(video_name, dir_name) == -1) {
    lprintf(MSG_ERROR, "Video file conversion error!\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Video convert image successful!\n");

  // Read the image, convert it into gray image, and then equalize the
  // histogram.
  for (int i = 1; i < 9999; i++) {
    string img_name = dir_name + forward_slash + to_string(i) + suffix_png;

    Mat img = imread(img_name);
    if (img.empty()) break;

    Mat image_gray;
    cvtColor(img, image_gray, COLOR_BGR2GRAY);
    equalizeHist(image_gray, image_gray);

    vector<Rect> smiles = detectSmile(image_gray);

    if (!smiles.empty()) imwrite(smile_name, img);
  }
  lprintf(MSG_INFO, "Smile detector successful!\n");

  if (__rmdir__(dir_name) == -1) {
    lprintf(MSG_ERROR, "Delete temp dir error.\n");
    lprintf(MSG_INFO, "Return code -1.\n");
    return -1;
  }
  lprintf(MSG_INFO, "Delete temp dir successful!\n");

  return 0;
}